

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O3

void * dja::mat3::memcpy(void *__dest,void *__src,size_t __n)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  
  uVar6 = *(undefined4 *)((long)__src + 0xc);
  uVar1 = *(undefined4 *)((long)__src + 0x10);
  uVar7 = *(undefined4 *)((long)__src + 0x18);
  uVar8 = *(undefined4 *)((long)__src + 0x1c);
  uVar2 = *(undefined4 *)((long)__src + 0x20);
  uVar3 = *(undefined4 *)((long)__src + 8);
  uVar4 = *(undefined4 *)((long)__src + 4);
  uVar5 = *(undefined4 *)((long)__src + 0x14);
  if ((int)__n != 0) {
    uVar3 = uVar7;
    uVar4 = uVar6;
    uVar5 = uVar8;
    uVar6 = *(undefined4 *)((long)__src + 4);
    uVar7 = *(undefined4 *)((long)__src + 8);
    uVar8 = *(undefined4 *)((long)__src + 0x14);
  }
  *(undefined4 *)__dest = *__src;
  *(undefined4 *)((long)__dest + 4) = uVar6;
  *(undefined4 *)((long)__dest + 8) = uVar7;
  *(undefined4 *)((long)__dest + 0xc) = uVar4;
  *(undefined4 *)((long)__dest + 0x10) = uVar1;
  *(undefined4 *)((long)__dest + 0x14) = uVar8;
  *(undefined4 *)((long)__dest + 0x18) = uVar3;
  *(undefined4 *)((long)__dest + 0x1c) = uVar5;
  *(undefined4 *)((long)__dest + 0x20) = uVar2;
  return __dest;
}

Assistant:

mat3 mat3::memcpy(const float_t *v, bool rowmajor)
{
    mat3 m;
    std::memcpy(&m[0][0], v, sizeof(mat3));
    return rowmajor ? m : transpose(m);
}